

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_get_preferred_sample_rate(cubeb_conflict *ctx,uint32_t *rate)

{
  uint32_t *rate_local;
  cubeb_conflict *ctx_local;
  int local_4;
  
  if (ctx->default_sink_info == (cubeb_default_sink_info *)0x0) {
    local_4 = -1;
  }
  else {
    *rate = ctx->default_sink_info->sample_spec_rate;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
pulse_get_preferred_sample_rate(cubeb * ctx, uint32_t * rate)
{
  assert(ctx && rate);
  (void)ctx;

  if (!ctx->default_sink_info)
    return CUBEB_ERROR;

  *rate = ctx->default_sink_info->sample_spec_rate;

  return CUBEB_OK;
}